

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

bool __thiscall
cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::operator()
          (Object<(anonymous_namespace)::ObjectStruct> *this,ObjectStruct *out,Value *value,
          cmJSONState *state)

{
  bool bVar1;
  const_pointer pvVar2;
  size_type sVar3;
  function<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*)>
  *this_00;
  Value *__args_1;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_168;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  const_iterator local_108;
  allocator local_f9;
  undefined1 local_f8 [8];
  string name;
  Member *m;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
  *__range2;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_a0;
  undefined4 local_80;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_70;
  byte local_49;
  undefined1 local_48 [7];
  bool success;
  Members extraFields;
  cmJSONState *state_local;
  Value *value_local;
  ObjectStruct *out_local;
  Object<(anonymous_namespace)::ObjectStruct> *this_local;
  
  extraFields.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)state;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  local_49 = 1;
  if ((value == (Value *)0x0) && ((this->AnyRequired & 1U) != 0)) {
    std::
    function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator()(&local_70,&this->Error,RequiredMissing,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
              (&local_70,(Value *)0x0,
               (cmJSONState *)
               extraFields.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_70);
    this_local._7_1_ = false;
  }
  else if ((value == (Value *)0x0) || (bVar1 = Json::Value::isObject(value), bVar1)) {
    if (value != (Value *)0x0) {
      Json::Value::getMemberNames_abi_cxx11_((Members *)&__range2,value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    }
    __end0 = std::
             vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
             ::begin(&this->Members);
    m = (Member *)
        std::
        vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>
        ::end(&this->Members);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member_*,_std::vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>_>
                                       *)&m), bVar1) {
      name.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member_*,_std::vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>_>
           ::operator*(&__end0);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)name.field_2._8_8_);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)name.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_f8,pvVar2,sVar3,&local_f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      cmJSONState::push_stack
                ((cmJSONState *)
                 extraFields.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_f8,value);
      if ((value == (Value *)0x0) ||
         (bVar1 = Json::Value::isMember(value,(String *)local_f8), !bVar1)) {
        if ((*(byte *)(name.field_2._8_8_ + 0x30) & 1) == 0) {
          bVar1 = std::
                  function<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*)>
                  ::operator()((function<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*)>
                                *)(name.field_2._8_8_ + 0x10),out,(Value *)0x0,
                               (cmJSONState *)
                               extraFields.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            local_49 = 0;
          }
        }
        else {
          std::
          function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          ::operator()(&local_148,&this->Error,MissingRequired,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48);
          std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
                    (&local_148,value,
                     (cmJSONState *)
                     extraFields.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_148);
          local_49 = 0;
        }
      }
      else {
        this_00 = (function<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*)>
                   *)(name.field_2._8_8_ + 0x10);
        __args_1 = Json::Value::operator[](value,(String *)local_f8);
        bVar1 = std::
                function<bool_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*,_cmJSONState_*)>
                ::operator()(this_00,out,__args_1,
                             (cmJSONState *)
                             extraFields.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) {
          local_49 = 0;
        }
        local_118._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48);
        local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_48);
        local_110 = std::
                    find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                              (local_118,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_120,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_108,&local_110);
        local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,local_108);
      }
      cmJSONState::pop_stack
                ((cmJSONState *)
                 extraFields.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_f8);
      __gnu_cxx::
      __normal_iterator<const_cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member_*,_std::vector<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member,_std::allocator<cmJSONHelperBuilder::Object<(anonymous_namespace)::ObjectStruct>::Member>_>_>
      ::operator++(&__end0);
    }
    if (((this->AllowExtra & 1U) == 0) &&
       (bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_48), !bVar1)) {
      std::
      function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()(&local_168,&this->Error,ExtraField,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_48);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
                (&local_168,value,
                 (cmJSONState *)
                 extraFields.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_168);
      local_49 = 0;
    }
    this_local._7_1_ = (bool)(local_49 & 1);
  }
  else {
    std::
    function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator()(&local_a0,&this->Error,InvalidObject,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
    std::function<void_(const_Json::Value_*,_cmJSONState_*)>::operator()
              (&local_a0,value,
               (cmJSONState *)
               extraFields.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_a0);
    this_local._7_1_ = false;
  }
  local_80 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return this_local._7_1_;
}

Assistant:

bool operator()(T& out, const Json::Value* value, cmJSONState* state) const
    {
      Json::Value::Members extraFields;
      bool success = true;
      if (!value && this->AnyRequired) {
        Error(JsonErrors::ObjectError::RequiredMissing, extraFields)(value,
                                                                     state);
        return false;
      }
      if (value && !value->isObject()) {
        Error(JsonErrors::ObjectError::InvalidObject, extraFields)(value,
                                                                   state);
        return false;
      }
      if (value) {
        extraFields = value->getMemberNames();
      }

      for (auto const& m : this->Members) {
        std::string name(m.Name.data(), m.Name.size());
        state->push_stack(name, value);
        if (value && value->isMember(name)) {
          if (!m.Function(out, &(*value)[name], state)) {
            success = false;
          }
          extraFields.erase(
            std::find(extraFields.begin(), extraFields.end(), name));
        } else if (!m.Required) {
          if (!m.Function(out, nullptr, state)) {
            success = false;
          }
        } else {
          Error(JsonErrors::ObjectError::MissingRequired, extraFields)(value,
                                                                       state);
          success = false;
        }
        state->pop_stack();
      }

      if (!this->AllowExtra && !extraFields.empty()) {
        Error(JsonErrors::ObjectError::ExtraField, extraFields)(value, state);
        success = false;
      }
      return success;
    }